

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::unpack(vm_val_t *retval,char *fmt,size_t fmtlen,CVmDataSource *src)

{
  vm_obj_id_t obj;
  int iVar1;
  CVmObject *__s;
  char *pcVar2;
  int __c;
  CVmPackPos *in_RDI;
  CVmPackGroup root;
  CVmPackPos p;
  int retcnt;
  CVmObjList *retlst;
  size_t in_stack_ffffffffffffff58;
  CVmPackPos *this;
  CVmPackPos *in_stack_ffffffffffffff68;
  CVmPackGroup *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffa4;
  CVmPackGroup *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  utf8_ptr in_stack_ffffffffffffffb8;
  CVmPackPos *in_stack_ffffffffffffffc0;
  
  this = in_RDI;
  obj = CVmObjList::create((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff58);
  vm_val_t::set_obj((vm_val_t *)this,obj);
  __s = vm_objp(0);
  CVmObjList::cons_clear((CVmObjList *)this);
  CVmStack::push((vm_val_t *)in_RDI);
  CVmPackPos::CVmPackPos
            ((CVmPackPos *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(size_t)this)
  ;
  CVmPackGroup::CVmPackGroup
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(CVmDataSource *)this);
  unpack_group(in_stack_ffffffffffffffc0,(CVmObjList *)in_stack_ffffffffffffffb8.p_,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  iVar1 = CVmPackPos::more(this);
  if (iVar1 != 0) {
    pcVar2 = CVmPackPos::index((CVmPackPos *)&stack0xffffffffffffffb8,(char *)__s,__c);
    err_throw_a(0x6b,1,0,(ulong)pcVar2 & 0xffffffff);
  }
  CVmObjList::cons_set_len((CVmObjList *)this,in_stack_ffffffffffffff58);
  CVmStack::discard();
  return;
}

Assistant:

void CVmPack::unpack(VMG_ vm_val_t *retval, const char *fmt, size_t fmtlen,
                     CVmDataSource *src)
{
    /* 
     *   Set up a list for the return value.  We don't know how many elements
     *   we'll need, so allocate an initial chunk now and expand later as
     *   needed.  (We can't necessarily know the return size even by
     *   pre-parsing the format string, since it could have variable-size
     *   items with array counts.)  
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *retlst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   since we're going to build the list iteratively, clear it out, so
     *   that it doesn't contain any uninitialized elements that the garbage
     *   collector might encounter 
     */
    retlst->cons_clear();

    /* save it on the stack for gc protection */
    G_stk->push(retval);

    /* we don't have any elements in our list yet */
    int retcnt = 0;

    /* unpack the root group */
    CVmPackPos p(fmt, fmtlen);
    CVmPackGroup root(&p, src);
    unpack_group(vmg_ &p, retlst, &retcnt, &root, FALSE);

    /* make sure we made it all the way through the format string */
    if (p.more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p.index());

    /* set the return list's final length */
    retlst->cons_set_len(retcnt);

    /* discard the gc protection */
    G_stk->discard();
}